

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O1

LY_ERR lyplg_type_store_bits
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  byte *pbVar1;
  uint uVar2;
  lysc_type_bitenum_item *plVar3;
  bool bVar4;
  int iVar5;
  LY_ERR LVar6;
  size_t sVar7;
  void *pvVar8;
  ushort **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    sVar7 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
    if (sVar7 != value_len) {
      sVar7 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      LVar6 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                         "Invalid LYB bits value size %zu (expected %zu).",value_len,sVar7);
      goto LAB_001bde52;
    }
    if ((options & 1) == 0) {
      pvVar8 = malloc(value_len);
      (storage->field_2).dyn_mem = pvVar8;
      if (pvVar8 == (void *)0x0) goto LAB_001bdeb3;
      memcpy(pvVar8,value,value_len);
    }
    else {
      (storage->field_2).dyn_mem = value;
      options = 0;
    }
    lVar18 = *(long *)((long)&storage->field_2 + 8);
    if (lVar18 == 0) {
      if (type[1].name == (char *)0x0) {
        sVar15 = 8;
      }
      else {
        sVar15 = *(long *)(type[1].name + -8) * 8 + 8;
      }
      plVar12 = (long *)calloc(1,sVar15);
    }
    else {
      if (type[1].name == (char *)0x0) {
        lVar14 = 0;
      }
      else {
        lVar14 = *(long *)(type[1].name + -8);
      }
      plVar12 = (long *)realloc((void *)(lVar18 + -8),(lVar14 + *(long *)(lVar18 + -8)) * 8 + 8);
    }
    if (plVar12 == (long *)0x0) {
      bVar4 = false;
      LVar6 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
    }
    else {
      *(long **)((long)&storage->field_2 + 8) = plVar12 + 1;
      LVar6 = LY_SUCCESS;
      if (type[1].name == (char *)0x0) {
        sVar15 = 0;
      }
      else {
        sVar15 = *(long *)(type[1].name + -8) << 3;
      }
      memset(plVar12 + *plVar12 + 1,0,sVar15);
      bVar4 = true;
    }
    if (bVar4) {
      bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                        *(lysc_type_bitenum_item ***)((long)&storage->field_2 + 8));
    }
  }
  else {
    LVar6 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar6 != LY_SUCCESS) goto LAB_001bde52;
    sVar7 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
    pvVar8 = malloc(sVar7);
    (storage->field_2).dyn_mem = pvVar8;
    if (pvVar8 != (void *)0x0) {
      sVar7 = lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
      memset(pvVar8,0,sVar7);
      LVar6 = LY_SUCCESS;
      if (value_len != 0) {
        plVar3 = (storage->field_2).enum_item;
        uVar10 = 0;
        ppuVar9 = __ctype_b_loc();
        do {
          uVar16 = uVar10 + 1;
          if (uVar10 + 1 < value_len) {
            uVar16 = value_len;
          }
          do {
            uVar11 = uVar10;
            if ((*(byte *)((long)*ppuVar9 + (long)*(char *)((long)value + uVar10) * 2 + 1) & 0x20)
                == 0) break;
            uVar10 = uVar10 + 1;
            uVar11 = uVar16;
          } while (uVar16 != uVar10);
          LVar6 = LY_SUCCESS;
          if (uVar11 == value_len) break;
          uVar10 = uVar11;
          uVar16 = uVar11;
          if (uVar11 < value_len) {
            do {
              uVar10 = uVar16;
              if ((*(byte *)((long)*ppuVar9 + (long)*(char *)((long)value + uVar16) * 2 + 1) & 0x20)
                  != 0) break;
              uVar16 = uVar16 + 1;
              uVar10 = value_len;
            } while (value_len != uVar16);
          }
          lVar18 = 0;
          uVar16 = 0;
          while( true ) {
            pcVar17 = type[1].name;
            if (pcVar17 == (char *)0x0) {
              uVar13 = 0;
            }
            else {
              uVar13 = *(ulong *)(pcVar17 + -8);
            }
            if (uVar13 <= uVar16) {
              LVar6 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                                 "Invalid bit \"%.*s\".",uVar10 - uVar11,
                                 (char *)((long)value + uVar11));
              goto LAB_001bdf1e;
            }
            iVar5 = ly_strncmp(*(char **)(pcVar17 + lVar18),(char *)((long)value + uVar11),
                               uVar10 - uVar11);
            if (iVar5 == 0) break;
            uVar16 = uVar16 + 1;
            lVar18 = lVar18 + 0x28;
          }
          lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
          uVar2 = *(uint *)(type[1].name + lVar18 + 0x20);
          if (((0x1000000 << ((byte)uVar2 & 7)) >> 0x18 &
              (int)*(char *)((long)&plVar3->name + (ulong)(uVar2 >> 3))) != 0) {
            LVar6 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                               "Duplicate bit \"%s\".",*(undefined8 *)(type[1].name + lVar18));
            break;
          }
          lyplg_type_bits_bitmap_size((lysc_type_bits *)type);
          pbVar1 = (byte *)((long)&plVar3->name +
                           (ulong)(*(uint *)(type[1].name + lVar18 + 0x20) >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)*(uint *)(type[1].name + lVar18 + 0x20) & 7));
          LVar6 = LY_SUCCESS;
        } while (uVar10 < value_len);
      }
LAB_001bdf1e:
      if (LVar6 == LY_SUCCESS) {
        lVar18 = *(long *)((long)&storage->field_2 + 8);
        if (lVar18 == 0) {
          if (type[1].name == (char *)0x0) {
            sVar15 = 8;
          }
          else {
            sVar15 = *(long *)(type[1].name + -8) * 8 + 8;
          }
          plVar12 = (long *)calloc(1,sVar15);
        }
        else {
          if (type[1].name == (char *)0x0) {
            lVar14 = 0;
          }
          else {
            lVar14 = *(long *)(type[1].name + -8);
          }
          plVar12 = (long *)realloc((void *)(lVar18 + -8),(lVar14 + *(long *)(lVar18 + -8)) * 8 + 8)
          ;
        }
        if (plVar12 == (long *)0x0) {
          bVar4 = false;
          LVar6 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_store_bits");
        }
        else {
          *(long **)((long)&storage->field_2 + 8) = plVar12 + 1;
          LVar6 = LY_SUCCESS;
          if (type[1].name == (char *)0x0) {
            sVar15 = 0;
          }
          else {
            sVar15 = *(long *)(type[1].name + -8) << 3;
          }
          memset(plVar12 + *plVar12 + 1,0,sVar15);
          bVar4 = true;
        }
        if ((bVar4) &&
           (bits_bitmap2items((char *)(storage->field_2).enum_item,(lysc_type_bits *)type,
                              *(lysc_type_bitenum_item ***)((long)&storage->field_2 + 8)),
           format == LY_VALUE_CANON)) {
          if ((options & 1) == 0) {
            pcVar17 = "";
            if (value_len != 0) {
              pcVar17 = (char *)value;
            }
            LVar6 = lydict_insert(ctx,pcVar17,value_len,&storage->_canonical);
          }
          else {
            LVar6 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
            options = 0;
          }
        }
      }
      goto LAB_001bde52;
    }
LAB_001bdeb3:
    LVar6 = LY_EMEM;
  }
LAB_001bde52:
  if ((options & 1) != 0) {
    free(value);
  }
  if (LVar6 != LY_SUCCESS) {
    lyplg_type_free_bits(ctx,storage);
  }
  return LVar6;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_bits(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)type;
    struct lyd_value_bits *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != lyplg_type_bits_bitmap_size(type_bits)) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB bits value size %zu (expected %zu).",
                    value_len, lyplg_type_bits_bitmap_size(type_bits));
            goto cleanup;
        }

        /* store value (bitmap) */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            val->bitmap = (char *)value;
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        } else {
            val->bitmap = malloc(value_len);
            LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
            memcpy(val->bitmap, value, value_len);
        }

        /* allocate and fill the bit item array */
        LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
        bits_bitmap2items(val->bitmap, type_bits, val->items);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate the bitmap */
    val->bitmap = malloc(lyplg_type_bits_bitmap_size(type_bits));
    LY_CHECK_ERR_GOTO(!val->bitmap, ret = LY_EMEM, cleanup);
    memset(val->bitmap, 0, lyplg_type_bits_bitmap_size(type_bits));

    /* fill the bitmap */
    ret = bits_str2bitmap(value, value_len, type_bits, val->bitmap, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* allocate and fill the bit item array */
    LY_ARRAY_CREATE_GOTO(ctx, val->items, LY_ARRAY_COUNT(type_bits->bits), ret, cleanup);
    bits_bitmap2items(val->bitmap, type_bits, val->items);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret != LY_SUCCESS, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_bits(ctx, storage);
    }
    return ret;
}